

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O0

void oonf_stream_close_all_sessions(oonf_stream_socket *stream_socket)

{
  list_entity *plVar1;
  bool bVar2;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_stream_session *ptr;
  oonf_stream_session *session;
  oonf_stream_socket *stream_socket_local;
  
  bVar2 = false;
  if ((stream_socket->_node).next != (list_entity *)0x0) {
    bVar2 = (stream_socket->_node).prev != (list_entity *)0x0;
  }
  if (bVar2) {
    plVar1 = (stream_socket->session).next;
    ptr = (oonf_stream_session *)(plVar1 + -0x16);
    plVar1 = plVar1->next;
    while (__tempptr = plVar1 + -0x16, (ptr->node).prev != (stream_socket->session).prev) {
      if (((ptr->out)._len == 0) && ((ptr->busy & 1U) == 0)) {
        oonf_stream_close(ptr);
      }
      ptr = (oonf_stream_session *)__tempptr;
      plVar1 = plVar1->next;
    }
  }
  return;
}

Assistant:

void
oonf_stream_close_all_sessions(struct oonf_stream_socket *stream_socket) {
  struct oonf_stream_session *session, *ptr;

  if (!list_is_node_added(&stream_socket->_node)) {
    return;
  }

  list_for_each_element_safe(&stream_socket->session, session, node, ptr) {
    if (abuf_getlen(&session->out) == 0 && !session->busy) {
      /* close everything that doesn't need to send data anymore */
      oonf_stream_close(session);
    }
  }
  return;
}